

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample_fractional.c
# Opt level: O2

void WebRtcSpl_Resample44khzTo32khz(int32_t *In,int32_t *Out,size_t K)

{
  int32_t *in2;
  bool bVar1;
  
  in2 = In + 0x11;
  while (bVar1 = K != 0, K = K - 1, bVar1) {
    *Out = in2[-0xe] << 0xf | 0x4000;
    ((uint *)Out)[4] =
         in2[-4] * 0x7e + in2[-5] * -0x2c8 + 0x4000 +
         in2[-6] * 0x931 + in2[-7] * -0x1866 + in2[-8] * 0x54bb +
         in2[-9] * 0x48ab + in2[-10] * -0xf17 + in2[-0xb] * 0x3ce + in2[-0xc] * -0x9c;
    WebRtcSpl_ResampDotProduct
              (in2 + -0x11,in2,kCoefficients44To32[0],(int32_t *)((uint *)Out + 1),
               (int32_t *)((uint *)Out + 7));
    WebRtcSpl_ResampDotProduct
              (in2 + -0xf,in2 + -2,kCoefficients44To32[1],(int32_t *)((uint *)Out + 2),
               (int32_t *)((uint *)Out + 6));
    WebRtcSpl_ResampDotProduct
              (in2 + -0xe,in2 + -3,kCoefficients44To32[2],(int32_t *)((uint *)Out + 3),
               (int32_t *)((uint *)Out + 5));
    in2 = in2 + 0xb;
    Out = (int32_t *)((uint *)Out + 8);
  }
  return;
}

Assistant:

void WebRtcSpl_Resample44khzTo32khz(const int32_t *In, int32_t *Out, size_t K)
{
    /////////////////////////////////////////////////////////////
    // Filter operation:
    //
    // Perform resampling (11 input samples -> 8 output samples);
    // process in sub blocks of size 11 samples.
    int32_t tmp;
    size_t m;

    for (m = 0; m < K; m++)
    {
        tmp = 1 << 14;

        // first output sample
        Out[0] = ((int32_t)In[3] << 15) + tmp;

        // sum and accumulate filter coefficients and input samples
        tmp += kCoefficients44To32[3][0] * In[5];
        tmp += kCoefficients44To32[3][1] * In[6];
        tmp += kCoefficients44To32[3][2] * In[7];
        tmp += kCoefficients44To32[3][3] * In[8];
        tmp += kCoefficients44To32[3][4] * In[9];
        tmp += kCoefficients44To32[3][5] * In[10];
        tmp += kCoefficients44To32[3][6] * In[11];
        tmp += kCoefficients44To32[3][7] * In[12];
        tmp += kCoefficients44To32[3][8] * In[13];
        Out[4] = tmp;

        // sum and accumulate filter coefficients and input samples
        WebRtcSpl_ResampDotProduct(&In[0], &In[17], kCoefficients44To32[0], &Out[1], &Out[7]);

        // sum and accumulate filter coefficients and input samples
        WebRtcSpl_ResampDotProduct(&In[2], &In[15], kCoefficients44To32[1], &Out[2], &Out[6]);

        // sum and accumulate filter coefficients and input samples
        WebRtcSpl_ResampDotProduct(&In[3], &In[14], kCoefficients44To32[2], &Out[3], &Out[5]);

        // update pointers
        In += 11;
        Out += 8;
    }
}